

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O0

void SPARSITY_PREPROC_SYST_CSR(int *colVals,int *rowPtr,int *consP,int NCELLS,int base)

{
  int iVar1;
  int in_ECX;
  int *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  int in_R8D;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int k_11;
  int l_1;
  int offset_1;
  int nc_1;
  int nJdata_tmp_1;
  int k_10;
  int l;
  int offset;
  int nc;
  int nJdata_tmp;
  int n;
  GpuArray<double,_9U> conc;
  GpuArray<double,_100U> Jac;
  int m;
  int k_9;
  Real dehmixdc;
  Real tmp2;
  Real tmp3;
  Real tmp1;
  Real cmixinv;
  int k_8;
  Real dehmixdT;
  Real dcmixdT;
  Real ehmix;
  Real cmix;
  Real *eh_RT;
  Real e_RT [9];
  Real dcRdT [9];
  Real c_R [9];
  int k_7;
  int k_6;
  int k_5;
  int k_4;
  int k_3;
  int k_2;
  Real log10e;
  Real ln10;
  Real dlnCorrdT;
  Real dlogFdlogPr;
  Real dlogFcentdT;
  Real dlogFdT;
  Real dlogfPrdT;
  Real dlogPrdT;
  Real dlogFdcn_fac;
  Real dlogFdn;
  Real dlogFdc;
  Real Fcent;
  Real Fcent3;
  Real Fcent2;
  Real Fcent1;
  Real troe;
  Real troePr;
  Real troePr_den;
  Real troe_n;
  Real troe_c;
  Real logFcent;
  Real logPr;
  Real k_0;
  Real F;
  Real fPr;
  Real Pr;
  Real dqdc [9];
  Real dcdc_fac;
  Real dqdci;
  Real dqdT;
  Real dkrdT;
  Real dlnKcdT;
  Real dlnk0dT;
  Real dlnkfdT;
  Real alpha;
  Real Corr;
  Real q_nocor;
  Real q;
  Real Kc;
  Real phi_r;
  Real k_r;
  Real k_f;
  Real phi_f;
  Real h_RT [9];
  Real g_RT [9];
  int k_1;
  Real mixture;
  Real refCinv;
  Real refC;
  Real invT2;
  Real invT;
  Real tc [5];
  int k;
  Real wdot [9];
  int i;
  Real invT_1;
  Real T;
  Real invT_2;
  Real T_1;
  Real T_2;
  Real T_3;
  Real T_5;
  Real T_4;
  Real invT_3;
  Real T_6;
  int local_92c;
  int local_928;
  int local_920;
  int local_91c;
  int local_918;
  int local_914;
  int local_90c;
  int local_908;
  int local_904;
  double local_900 [9];
  double local_8b8 [100];
  int local_598;
  int local_594;
  int *local_590;
  undefined4 *local_588;
  long local_580;
  undefined4 local_574;
  double *local_570;
  int local_564;
  double *local_560;
  int local_558;
  int local_554;
  double local_550;
  double local_548;
  double local_540;
  double local_538;
  double local_530;
  int local_524;
  double local_520;
  double local_518;
  double local_510;
  double local_508;
  double *local_500;
  double local_4f8;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  double local_4a8 [10];
  double local_458 [9];
  int local_410;
  int local_40c;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  double local_3a8;
  double local_3a0;
  undefined8 local_398;
  double local_390;
  double local_388;
  double local_380;
  double local_378;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  double local_330;
  double local_328 [10];
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_208;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  int local_1b4;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  int local_15c;
  double local_158 [9];
  int local_110;
  int local_10c;
  double local_108;
  double *local_100;
  double *local_f8;
  double local_f0;
  double local_e8;
  double *local_e0;
  double *local_d8;
  undefined4 local_ac;
  double *local_a8;
  double local_a0;
  double local_98;
  double *local_90;
  double *local_88;
  double local_80;
  double *local_78;
  double *local_70;
  double local_38;
  double *local_30;
  double *local_28;
  double local_20;
  double local_18;
  double *local_10;
  double *local_8;
  
  local_598 = in_R8D;
  local_594 = in_ECX;
  local_590 = in_RDX;
  local_588 = in_RSI;
  local_580 = in_RDI;
  memset(local_8b8,0,800);
  memset(local_900,0,0x48);
  for (local_904 = 0; local_904 < 9; local_904 = local_904 + 1) {
    local_564 = local_904;
    local_560 = local_900;
    local_560[local_904] = 0.1111111111111111;
  }
  local_f8 = local_8b8;
  local_ac = 0;
  local_570 = local_900;
  local_574 = 0;
  local_10c = *local_590;
  local_108 = 1500.0;
  for (local_110 = 0; local_110 < 100; local_110 = local_110 + 1) {
    local_f8[local_110] = 0.0;
  }
  for (local_15c = 0; local_15c < 9; local_15c = local_15c + 1) {
    local_158[local_15c] = 0.0;
  }
  local_100 = local_570;
  local_a8 = local_f8;
  dVar2 = log(1500.0);
  local_180 = local_108;
  dVar3 = local_108 * local_108;
  dVar4 = local_108 * local_108 * local_108;
  dVar5 = local_108 * local_108 * local_108 * local_108;
  local_190 = 1.0 / local_108;
  local_198 = local_190 * local_190;
  local_1a0 = 12186.6002121605 / local_108;
  local_1a8 = 1.0 / local_1a0;
  local_1b0 = 0.0;
  for (local_1b4 = 0; local_1b4 < 9; local_1b4 = local_1b4 + 1) {
    local_1b0 = local_100[local_1b4] + local_1b0;
  }
  local_d8 = &local_208;
  local_e0 = &local_188;
  local_e8 = local_108;
  local_f0 = 1.0 / local_108;
  if (1000.0 <= local_108) {
    local_208 = dVar5 * -7.91375895e-17 +
                dVar4 * 7.692981816666667e-13 +
                dVar3 * 9.389714483333333e-09 +
                local_108 * -0.0003500322055 +
                dVar2 * -2.99142337 + local_f0 * -835.033997 + 4.34653354;
    local_200 = local_168 * 5.68217655e-17 +
                local_170 * -1.479401233333333e-12 +
                local_178 * 2.098069983333333e-08 +
                local_108 * -0.0003067598445 +
                local_188 * -3.69757819 + local_f0 * -1233.93018 + 0.5084126000000002;
    local_1f8 = local_168 * 3.195808935e-16 +
                local_170 * -1.000830325e-11 +
                local_178 * 1.455043351666667e-07 +
                local_108 * -0.001528146445 +
                local_188 * -2.67214561 + local_f0 * -29899.209 + -4.190671200000001;
    local_1f0 = local_168 * -0.0 +
                local_170 * -0.0 +
                local_178 * -0.0 +
                local_108 * -0.0 + local_188 * -2.5 + local_f0 * 25471.627 + 2.960117638;
    local_1e8 = local_168 * 2.18402575e-17 +
                local_170 * -3.792556183333333e-13 +
                local_178 * 5.171338916666667e-10 +
                local_108 * 1.377530955e-05 +
                local_188 * -2.54205966 + local_f0 * 29230.8027 + -2.37824845;
    local_1e0 = local_168 * 6.6597938e-17 +
                local_170 * -2.54348895e-12 +
                local_178 * 4.318045966666667e-08 +
                local_108 * -0.00052825224 +
                local_188 * -2.86472886 + local_f0 * 3683.62875 + -2.83691187;
    local_1d8 = local_168 * 5.39542675e-16 +
                local_170 * -9.520530833333334e-12 +
                local_178 * 1.056096916666667e-07 +
                local_108 * -0.001119910065 +
                local_188 * -4.0172109 + local_f0 * 111.856713 + 0.2321087500000001;
    local_1d0 = local_168 * 7.1582678e-16 +
                local_170 * -1.957419641666667e-11 +
                local_178 * 2.4578147e-07 +
                local_108 * -0.002168068195 +
                local_188 * -4.57316685 + local_f0 * -18006.9609 + 4.072029891;
    local_1c8 = local_168 * 3.3766755e-16 +
                local_170 * -8.4142e-12 +
                local_178 * 9.474601666666666e-08 +
                local_108 * -0.0007439885 + local_188 * -2.92664 + local_f0 * -922.7977 + -3.053888;
  }
  else {
    local_208 = dVar5 * -2.06743612e-14 +
                dVar4 * 7.896195275e-12 +
                dVar3 * 1.357169215e-07 +
                local_108 * -0.000412472087 +
                dVar2 * -3.29812431 + local_f0 * -1012.52087 + 6.5922184;
    local_200 = local_168 * 4.38427696e-14 +
                local_170 * -1.094897691666667e-10 +
                local_178 * 9.593584116666666e-08 +
                local_108 * -0.000563743175 +
                local_188 * -3.2129364 + local_f0 * -1005.24902 + -2.82180119;
    local_1f8 = local_168 * 1.253294235e-13 +
                local_170 * -5.807151058333333e-10 +
                local_178 * 1.059116055e-06 +
                local_108 * -0.00173749123 +
                local_188 * -3.38684249 + local_f0 * -30208.1133 + 0.7966096399999998;
    local_1f0 = local_168 * -0.0 +
                local_170 * -0.0 +
                local_178 * -0.0 +
                local_108 * -0.0 + local_188 * -2.5 + local_f0 * 25471.627 + 2.960117608;
    local_1e8 = local_168 * -1.94534818e-14 +
                local_170 * 1.335702658333333e-10 +
                local_178 * -4.035052833333333e-07 +
                local_108 * 0.000819083245 +
                local_188 * -2.94642878 + local_f0 * 29147.6445 + -0.01756619999999964;
    local_1e0 = local_168 * -1.031186895e-13 +
                local_170 * 4.832113691666666e-10 +
                local_178 * -1.087941151666667e-06 +
                local_108 * 0.001612724695 +
                local_188 * -4.12530561 + local_f0 * 3346.30913 + 4.81573857;
    local_1d8 = local_168 * -4.646125620000001e-13 +
                local_170 * 2.02303245e-09 +
                local_178 * -3.526381516666666e-06 +
                local_108 * 0.002374560255 +
                local_188 * -4.30179801 + local_f0 * 294.80804 + 0.5851355599999999;
    local_1d0 = local_168 * -1.235757375e-13 +
                local_170 * 3.854837933333333e-10 +
                local_178 * 2.475020966666667e-08 +
                local_108 * -0.003284612905 +
                local_188 * -3.38875365 + local_f0 * -17663.1465 + -3.39660955;
    local_1c8 = local_168 * 1.2224275e-13 +
                local_170 * -4.701262500000001e-10 +
                local_178 * 6.605369999999999e-07 +
                local_108 * -0.00070412 +
                local_188 * -3.298677 + local_f0 * -1020.9 + -0.6516950000000001;
  }
  local_88 = &local_258;
  local_90 = &local_188;
  local_98 = local_108;
  local_a0 = 1.0 / local_108;
  if (1000.0 <= local_108) {
    local_258 = local_a0 * -835.033997 +
                dVar5 * 3.16550358e-16 +
                dVar4 * -2.30789455e-12 +
                dVar3 * -1.8779429e-08 + local_108 * 0.000350032206 + 2.99142337;
    local_250 = local_a0 * -1233.93018 +
                dVar5 * -2.27287062e-16 +
                dVar4 * 4.4382037e-12 +
                dVar3 * -4.19613997e-08 + local_108 * 0.000306759845 + 3.69757819;
    local_248 = local_a0 * -29899.209 +
                dVar5 * -1.27832357e-15 +
                dVar4 * 3.00249098e-11 +
                dVar3 * -2.9100867e-07 + local_108 * 0.00152814644 + 2.67214561;
    local_240 = local_a0 * 25471.627 +
                dVar5 * 0.0 + dVar4 * 0.0 + dVar3 * 0.0 + local_108 * 0.0 + 2.5;
    local_238 = local_a0 * 29230.8027 +
                dVar5 * -8.736103e-17 +
                dVar4 * 1.13776685e-12 +
                dVar3 * -1.03426778e-09 + local_108 * -1.37753096e-05 + 2.54205966;
    local_230 = local_a0 * 3683.62875 +
                dVar5 * -2.66391752e-16 +
                dVar4 * 7.63046685e-12 +
                dVar3 * -8.63609193e-08 + local_108 * 0.00052825224 + 2.86472886;
    local_228 = local_a0 * 111.856713 +
                dVar5 * -2.1581707e-15 +
                dVar4 * 2.85615925e-11 +
                dVar3 * -2.11219383e-07 + local_108 * 0.00111991006 + 4.0172109;
    local_220 = local_a0 * -18006.9609 +
                dVar5 * -2.86330712e-15 +
                dVar4 * 5.87225893e-11 +
                dVar3 * -4.9156294e-07 + local_108 * 0.0021680682 + 4.57316685;
    local_218 = local_a0 * -922.7977 +
                dVar5 * -1.3506702e-15 +
                dVar4 * 2.52426e-11 + dVar3 * -1.89492033e-07 + local_108 * 0.0007439885 + 2.92664;
  }
  else {
    local_258 = local_a0 * -1012.52087 +
                dVar5 * 8.26974448e-14 +
                dVar4 * -2.36885858e-11 +
                dVar3 * -2.71433843e-07 + local_108 * 0.000412472087 + 3.29812431;
    local_250 = local_a0 * -1005.24902 +
                dVar5 * -1.75371078e-13 +
                dVar4 * 3.28469308e-10 +
                dVar3 * -1.91871682e-07 + local_108 * 0.000563743175 + 3.2129364;
    local_248 = local_a0 * -30208.1133 +
                dVar5 * -5.01317694e-13 +
                dVar4 * 1.74214532e-09 +
                dVar3 * -2.11823211e-06 + local_108 * 0.00173749123 + 3.38684249;
    local_240 = local_a0 * 25471.627 +
                dVar5 * 0.0 + dVar4 * 0.0 + dVar3 * 0.0 + local_108 * 0.0 + 2.5;
    local_238 = local_a0 * 29147.6445 +
                dVar5 * 7.78139272e-14 +
                dVar4 * -4.00710797e-10 +
                dVar3 * 8.07010567e-07 + local_108 * -0.000819083245 + 2.94642878;
    local_230 = local_a0 * 3346.30913 +
                dVar5 * 4.12474758e-13 +
                dVar4 * -1.44963411e-09 +
                dVar3 * 2.1758823e-06 + local_108 * -0.0016127247 + 4.12530561;
    local_228 = local_a0 * 294.80804 +
                dVar5 * 1.85845025e-12 +
                dVar4 * -6.06909735e-09 +
                dVar3 * 7.05276303e-06 + local_108 * -0.00237456025 + 4.30179801;
    local_220 = local_a0 * -17663.1465 +
                dVar5 * 4.9430295e-13 +
                dVar4 * -1.15645138e-09 +
                dVar3 * -4.95004193e-08 + local_108 * 0.0032846129 + 3.38875365;
    local_218 = local_a0 * -1020.9 +
                dVar5 * -4.88971e-13 +
                dVar4 * 1.41037875e-09 + dVar3 * -1.321074e-06 + local_108 * 0.00070412 + 3.298677;
  }
  local_188 = dVar2;
  local_178 = dVar3;
  local_170 = dVar4;
  local_168 = dVar5;
  local_3f0 = log(10.0);
  local_3f8 = log(10.0);
  local_3f8 = 1.0 / local_3f8;
  local_2a0 = local_100[2] * 10.0 + local_100[1] * -0.21999999999999997 + local_1b0 + *local_100;
  local_260 = local_100[1] * local_100[3];
  local_268 = exp(local_188 * 0.6 + -(local_190 * 0.0));
  local_268 = local_268 * 1475000.0;
  local_2a8 = local_190 * 0.6 + local_198 * 0.0;
  local_348 = exp(local_188 * -1.72 + -(local_190 * 264.08810621431707));
  local_348 = local_348 * 6.366e+20;
  local_330 = ((local_2a0 * 1e-12) / local_268) * local_348;
  local_338 = local_330 / (local_330 + 1.0);
  local_2b0 = local_190 * -1.72 + local_198 * 264.08810621431707;
  local_3c0 = local_3f8 * (local_2b0 - local_2a8);
  local_3c8 = local_3c0 / (local_330 + 1.0);
  local_350 = log10(local_330);
  local_388 = exp(-local_108 / 1e-30);
  local_388 = local_388 * 0.19999999999999996;
  local_390 = exp(-local_108 / 1e+30);
  local_390 = local_390 * 0.8;
  local_398 = 0;
  local_3a0 = local_388 + local_390 + 0.0;
  local_358 = log10(local_3a0);
  local_360 = local_358 * -0.67 + -0.4;
  local_368 = local_358 * -1.27 + 0.75;
  local_370 = 1.0 / ((local_360 + local_350) * -0.14 + local_368);
  local_378 = (local_360 + local_350) * local_370;
  local_380 = 1.0 / (local_378 * local_378 + 1.0);
  local_340 = pow(10.0,local_358 * local_380);
  dVar2 = local_1a8;
  local_3d8 = (local_3f8 / local_3a0) * (-local_388 / 1e-30 - local_390 / 1e+30);
  local_3b8 = local_358 * 2.0 * local_380 * local_380 * local_378 * local_370;
  local_3e0 = -local_368 * local_3b8 * local_370;
  local_3b0 = local_3b8 * local_378;
  local_3d0 = local_3d8 * (local_3b0 * -1.27 + local_3e0 * -0.67 + local_380) +
              local_3e0 * local_3c0;
  local_278 = local_100[6];
  local_3a8 = local_3e0;
  dVar3 = exp((local_200 + local_1f0) - local_1d8);
  local_280 = dVar2 * dVar3;
  dVar2 = local_268 / (dVar2 * dVar3);
  local_2b8 = local_190 * (-(local_250 + local_240) + local_228 + 1.0);
  local_2c0 = (local_2a8 - local_2b8) * dVar2;
  local_290 = local_268 * local_260 + -(dVar2 * local_278);
  local_298 = local_338 * local_340;
  local_288 = local_298 * local_290;
  local_3e8 = local_3f0 * (local_3c8 + local_3d0);
  local_2c8 = local_298 * (local_2a8 * local_268 * local_260 + -(local_2c0 * local_278)) +
              local_3e8 * local_288;
  local_158[1] = local_158[1] - local_288;
  local_158[3] = local_158[3] - local_288;
  local_158[6] = local_288 + local_158[6];
  local_268 = local_298 * local_268;
  local_270 = local_298 * dVar2;
  local_2d8 = (local_288 / local_2a0) * (1.0 / (local_330 + 1.0) + local_3e0);
  if (local_10c == 0) {
    local_328[0] = local_2d8 * 2.0;
    local_328[1] = local_2d8 * 0.78 + local_268 * local_100[3];
    local_328[2] = local_2d8 * 11.0;
    local_328[3] = local_268 * local_100[1] + local_2d8;
    local_328[4] = local_2d8;
    local_328[5] = local_2d8;
    local_328[6] = local_2d8 - local_298 * dVar2;
    local_328[7] = local_2d8;
    local_328[8] = local_2d8;
    for (local_3fc = 0; local_3fc < 9; local_3fc = local_3fc + 1) {
      iVar1 = local_3fc * 10 + 1;
      local_f8[iVar1] = local_f8[iVar1] - local_328[local_3fc];
      iVar1 = local_3fc * 10 + 3;
      local_f8[iVar1] = local_f8[iVar1] - local_328[local_3fc];
      iVar1 = local_3fc * 10 + 6;
      local_f8[iVar1] = local_328[local_3fc] + local_f8[iVar1];
    }
  }
  else {
    local_2d0 = local_2d8;
    local_f8[1] = local_f8[1] - local_2d8;
    local_f8[3] = local_f8[3] - local_2d0;
    local_f8[6] = local_2d0 + local_f8[6];
    local_2d0 = local_2d8 * -0.21999999999999997 + local_268 * local_100[3];
    local_f8[0xb] = local_f8[0xb] - local_2d0;
    local_f8[0xd] = local_f8[0xd] - local_2d0;
    local_f8[0x10] = local_2d0 + local_f8[0x10];
    local_2d0 = local_2d8 * 10.0;
    local_f8[0x15] = local_f8[0x15] - local_2d0;
    local_f8[0x17] = local_f8[0x17] - local_2d0;
    local_f8[0x1a] = local_2d0 + local_f8[0x1a];
    local_2d0 = local_268 * local_100[1];
    local_f8[0x1f] = local_f8[0x1f] - local_2d0;
    local_f8[0x21] = local_f8[0x21] - local_2d0;
    local_f8[0x24] = local_2d0 + local_f8[0x24];
    local_2d0 = -local_270;
    local_f8[0x3d] = local_f8[0x3d] - local_2d0;
    local_f8[0x3f] = local_f8[0x3f] - local_2d0;
    local_f8[0x42] = local_2d0 + local_f8[0x42];
  }
  local_f8[0x5b] = local_f8[0x5b] - local_2c8;
  local_f8[0x5d] = local_f8[0x5d] - local_2c8;
  local_f8[0x60] = local_2c8 + local_f8[0x60];
  local_2a0 = local_100[2] * 11.0 + *local_100 * 1.5 + local_1b0;
  local_260 = local_100[7];
  local_268 = exp(local_188 * 0.0 + -(local_190 * 24370.78312492259));
  local_268 = local_268 * 295100000000000.0;
  local_2a8 = local_190 * 0.0 + local_198 * 24370.78312492259;
  local_348 = exp(local_188 * 0.0 + -(local_190 * 22896.35829411476));
  local_348 = local_348 * 1.202e+17;
  local_330 = ((local_2a0 * 1e-06) / local_268) * local_348;
  local_338 = local_330 / (local_330 + 1.0);
  local_2b0 = local_190 * 0.0 + local_198 * 22896.35829411476;
  local_3c0 = local_3f8 * (local_2b0 - local_2a8);
  local_3c8 = local_3c0 / (local_330 + 1.0);
  local_350 = log10(local_330);
  local_388 = exp(-local_108 / 1e-30);
  local_388 = local_388 * 0.5;
  local_390 = exp(-local_108 / 1e+30);
  local_390 = local_390 * 0.5;
  local_398 = 0;
  local_3a0 = local_388 + local_390 + 0.0;
  local_358 = log10(local_3a0);
  local_360 = local_358 * -0.67 + -0.4;
  local_368 = local_358 * -1.27 + 0.75;
  local_370 = 1.0 / ((local_360 + local_350) * -0.14 + local_368);
  local_378 = (local_360 + local_350) * local_370;
  local_380 = 1.0 / (local_378 * local_378 + 1.0);
  local_340 = pow(10.0,local_358 * local_380);
  dVar2 = local_1a0;
  local_3d8 = (local_3f8 / local_3a0) * (-local_388 / 1e-30 - local_390 / 1e+30);
  local_3b8 = local_358 * 2.0 * local_380 * local_380 * local_378 * local_370;
  local_3e0 = -local_368 * local_3b8 * local_370;
  local_3b0 = local_3b8 * local_378;
  local_3d0 = local_3d8 * (local_3b0 * -1.27 + local_3e0 * -0.67 + local_380) +
              local_3e0 * local_3c0;
  local_278 = local_100[5] * local_100[5];
  local_3a8 = local_3e0;
  dVar3 = exp(local_1d0 - (local_1e0 + local_1e0));
  local_280 = dVar2 * dVar3;
  dVar2 = local_268 / (dVar2 * dVar3);
  local_2b8 = local_190 * ((local_230 + local_230 + -local_220) - 1.0);
  local_2c0 = (local_2a8 - local_2b8) * dVar2;
  local_290 = local_268 * local_260 + -(dVar2 * local_278);
  local_298 = local_338 * local_340;
  local_288 = local_298 * local_290;
  local_3e8 = local_3f0 * (local_3c8 + local_3d0);
  local_2c8 = local_298 * (local_2a8 * local_268 * local_260 + -(local_2c0 * local_278)) +
              local_3e8 * local_288;
  local_158[5] = local_288 + local_288 + local_158[5];
  local_158[7] = local_158[7] - local_288;
  local_268 = local_298 * local_268;
  local_270 = local_298 * dVar2;
  local_2d8 = (local_288 / local_2a0) * (1.0 / (local_330 + 1.0) + local_3e0);
  if (local_10c == 0) {
    local_328[0] = local_2d8 * 2.5;
    local_328[1] = local_2d8;
    local_328[2] = local_2d8 * 12.0;
    local_328[3] = local_2d8;
    local_328[4] = local_2d8;
    local_328[5] = -(local_298 * dVar2 * 2.0) * local_100[5] + local_2d8;
    local_328[6] = local_2d8;
    local_328[7] = local_2d8 + local_268;
    local_328[8] = local_2d8;
    for (local_400 = 0; local_400 < 9; local_400 = local_400 + 1) {
      iVar1 = local_400 * 10 + 5;
      local_f8[iVar1] = local_328[local_400] + local_328[local_400] + local_f8[iVar1];
      iVar1 = local_400 * 10 + 7;
      local_f8[iVar1] = local_f8[iVar1] - local_328[local_400];
    }
  }
  else {
    local_2d0 = local_2d8 * 1.5;
    local_f8[5] = local_2d0 + local_2d0 + local_f8[5];
    local_f8[7] = local_f8[7] - local_2d0;
    local_2d0 = local_2d8 * 11.0;
    local_f8[0x19] = local_2d0 + local_2d0 + local_f8[0x19];
    local_f8[0x1b] = local_f8[0x1b] - local_2d0;
    local_2d0 = -local_270 * 2.0 * local_100[5];
    local_f8[0x37] = local_2d0 + local_2d0 + local_f8[0x37];
    local_f8[0x39] = local_f8[0x39] - local_2d0;
    local_2d0 = local_268;
    local_f8[0x4b] = local_268 + local_268 + local_f8[0x4b];
    local_f8[0x4d] = local_f8[0x4d] - local_2d0;
  }
  local_f8[0x5f] = local_2c8 + local_2c8 + local_f8[0x5f];
  local_f8[0x61] = local_f8[0x61] - local_2c8;
  local_2a0 = local_100[2] * 11.0 + *local_100 * 1.5 + local_1b0;
  local_260 = *local_100;
  local_268 = exp(local_188 * -1.4 + -(local_190 * 52525.755576696676));
  dVar2 = local_1a0;
  local_268 = local_268 * 45770000000000.0;
  local_2a8 = local_190 * -1.4 + local_198 * 52525.755576696676;
  local_278 = local_100[3] * local_100[3];
  dVar3 = exp(local_208 - (local_1f0 + local_1f0));
  local_280 = dVar2 * dVar3;
  dVar2 = local_268 / (dVar2 * dVar3);
  local_2b8 = local_190 * ((local_240 + local_240 + -local_258) - 1.0);
  local_2c0 = (local_2a8 - local_2b8) * dVar2;
  local_290 = local_268 * local_260 + -(dVar2 * local_278);
  local_288 = local_2a0 * local_290;
  local_2c8 = local_2a0 * (local_2a8 * local_268 * local_260 + -(local_2c0 * local_278));
  local_158[0] = local_158[0] - local_288;
  local_158[3] = local_288 + local_288 + local_158[3];
  local_268 = local_2a0 * local_268;
  local_270 = local_2a0 * dVar2;
  if (local_10c == 0) {
    local_328[0] = local_290 * 2.5 + local_268;
    local_328[1] = local_290;
    local_328[2] = local_290 * 12.0;
    local_328[3] = -(local_2a0 * dVar2 * 2.0) * local_100[3] + local_290;
    local_328[4] = local_290;
    local_328[5] = local_290;
    local_328[6] = local_290;
    local_328[7] = local_290;
    local_328[8] = local_290;
    for (local_404 = 0; local_404 < 9; local_404 = local_404 + 1) {
      local_f8[local_404 * 10] = local_f8[local_404 * 10] - local_328[local_404];
      iVar1 = local_404 * 10 + 3;
      local_f8[iVar1] = local_328[local_404] + local_328[local_404] + local_f8[iVar1];
    }
  }
  else {
    local_2d0 = local_290 * 1.5 + local_268;
    *local_f8 = *local_f8 - local_2d0;
    local_f8[3] = local_2d0 + local_2d0 + local_f8[3];
    local_2d0 = local_290 * 11.0;
    local_f8[0x14] = local_f8[0x14] - local_2d0;
    local_f8[0x17] = local_2d0 + local_2d0 + local_f8[0x17];
    local_2d0 = -local_270 * 2.0 * local_100[3];
    local_f8[0x1e] = local_f8[0x1e] - local_2d0;
    local_f8[0x21] = local_2d0 + local_2d0 + local_f8[0x21];
  }
  local_f8[0x5a] = local_f8[0x5a] - local_2c8;
  local_f8[0x5d] = local_2c8 + local_2c8 + local_f8[0x5d];
  local_2a0 = local_100[2] * 11.0 + *local_100 * 1.5 + local_1b0;
  local_260 = local_100[4] * local_100[4];
  local_268 = exp(local_188 * -0.5 + -(local_190 * 0.0));
  dVar2 = local_1a8;
  local_268 = local_268 * 6165.0;
  local_2a8 = local_190 * -0.5 + local_198 * 0.0;
  local_278 = local_100[1];
  dVar3 = exp(local_1e8 + local_1e8 + -local_200);
  local_280 = dVar2 * dVar3;
  dVar2 = local_268 / (dVar2 * dVar3);
  local_2b8 = local_190 * ((local_250 - (local_238 + local_238)) + 1.0);
  local_2c0 = (local_2a8 - local_2b8) * dVar2;
  local_290 = local_268 * local_260 + -(dVar2 * local_278);
  local_288 = local_2a0 * local_290;
  local_2c8 = local_2a0 * (local_2a8 * local_268 * local_260 + -(local_2c0 * local_278));
  local_158[1] = local_288 + local_158[1];
  local_158[4] = local_158[4] - (local_288 + local_288);
  local_268 = local_2a0 * local_268;
  local_270 = local_2a0 * dVar2;
  if (local_10c == 0) {
    local_328[0] = local_290 * 2.5;
    local_328[1] = local_290 - local_2a0 * dVar2;
    local_328[2] = local_290 * 12.0;
    local_328[3] = local_290;
    local_328[4] = local_268 * 2.0 * local_100[4] + local_290;
    local_328[5] = local_290;
    local_328[6] = local_290;
    local_328[7] = local_290;
    local_328[8] = local_290;
    for (local_408 = 0; local_408 < 9; local_408 = local_408 + 1) {
      iVar1 = local_408 * 10 + 1;
      local_f8[iVar1] = local_328[local_408] + local_f8[iVar1];
      iVar1 = local_408 * 10 + 4;
      local_f8[iVar1] = local_f8[iVar1] - (local_328[local_408] + local_328[local_408]);
    }
  }
  else {
    local_2d0 = local_290 * 1.5;
    local_f8[1] = local_2d0 + local_f8[1];
    local_f8[4] = local_f8[4] - (local_2d0 + local_2d0);
    local_2d0 = -local_270;
    local_f8[0xb] = local_2d0 + local_f8[0xb];
    local_f8[0xe] = local_f8[0xe] - (local_2d0 + local_2d0);
    local_2d0 = local_290 * 11.0;
    local_f8[0x15] = local_2d0 + local_f8[0x15];
    local_f8[0x18] = local_f8[0x18] - (local_2d0 + local_2d0);
    local_2d0 = local_268 * 2.0 * local_100[4];
    local_f8[0x29] = local_2d0 + local_f8[0x29];
    local_f8[0x2c] = local_f8[0x2c] - (local_2d0 + local_2d0);
  }
  local_f8[0x5b] = local_2c8 + local_f8[0x5b];
  local_f8[0x5e] = local_f8[0x5e] - (local_2c8 + local_2c8);
  local_2a0 = local_100[2] * 11.0 + *local_100 * 1.5 + local_1b0;
  local_260 = local_100[3] * local_100[4];
  local_268 = exp(-(local_190 * 0.0) - local_188);
  dVar2 = local_1a8;
  local_268 = local_268 * 4714000.0;
  local_2a8 = local_198 * 0.0 - local_190;
  local_278 = local_100[5];
  dVar3 = exp((local_1f0 + local_1e8) - local_1e0);
  local_280 = dVar2 * dVar3;
  dVar2 = local_268 / (dVar2 * dVar3);
  local_2b8 = local_190 * (-(local_240 + local_238) + local_230 + 1.0);
  local_2c0 = (local_2a8 - local_2b8) * dVar2;
  local_290 = local_268 * local_260 + -(dVar2 * local_278);
  local_288 = local_2a0 * local_290;
  local_2c8 = local_2a0 * (local_2a8 * local_268 * local_260 + -(local_2c0 * local_278));
  local_158[3] = local_158[3] - local_288;
  local_158[4] = local_158[4] - local_288;
  local_158[5] = local_288 + local_158[5];
  local_268 = local_2a0 * local_268;
  local_270 = local_2a0 * dVar2;
  if (local_10c == 0) {
    local_328[0] = local_290 * 2.5;
    local_328[1] = local_290;
    local_328[2] = local_290 * 12.0;
    local_328[3] = local_268 * local_100[4] + local_290;
    local_328[4] = local_268 * local_100[3] + local_290;
    local_328[5] = local_290 - local_2a0 * dVar2;
    local_328[6] = local_290;
    local_328[7] = local_290;
    local_328[8] = local_290;
    for (local_40c = 0; local_40c < 9; local_40c = local_40c + 1) {
      iVar1 = local_40c * 10 + 3;
      local_f8[iVar1] = local_f8[iVar1] - local_328[local_40c];
      iVar1 = local_40c * 10 + 4;
      local_f8[iVar1] = local_f8[iVar1] - local_328[local_40c];
      iVar1 = local_40c * 10 + 5;
      local_f8[iVar1] = local_328[local_40c] + local_f8[iVar1];
    }
  }
  else {
    local_2d0 = local_290 * 1.5;
    local_f8[3] = local_f8[3] - local_2d0;
    local_f8[4] = local_f8[4] - local_2d0;
    local_f8[5] = local_2d0 + local_f8[5];
    local_2d0 = local_290 * 11.0;
    local_f8[0x17] = local_f8[0x17] - local_2d0;
    local_f8[0x18] = local_f8[0x18] - local_2d0;
    local_f8[0x19] = local_2d0 + local_f8[0x19];
    local_2d0 = local_268 * local_100[4];
    local_f8[0x21] = local_f8[0x21] - local_2d0;
    local_f8[0x22] = local_f8[0x22] - local_2d0;
    local_f8[0x23] = local_2d0 + local_f8[0x23];
    local_2d0 = local_268 * local_100[3];
    local_f8[0x2b] = local_f8[0x2b] - local_2d0;
    local_f8[0x2c] = local_f8[0x2c] - local_2d0;
    local_f8[0x2d] = local_2d0 + local_f8[0x2d];
    local_2d0 = -local_270;
    local_f8[0x35] = local_f8[0x35] - local_2d0;
    local_f8[0x36] = local_f8[0x36] - local_2d0;
    local_f8[0x37] = local_2d0 + local_f8[0x37];
  }
  local_f8[0x5d] = local_f8[0x5d] - local_2c8;
  local_f8[0x5e] = local_f8[0x5e] - local_2c8;
  local_f8[0x5f] = local_2c8 + local_f8[0x5f];
  local_2a0 = local_100[2] * 11.0 + *local_100 * 1.5 + local_1b0;
  local_260 = local_100[3] * local_100[5];
  local_268 = exp(-(local_190 * 0.0) - (local_188 + local_188));
  dVar2 = local_1a8;
  local_268 = local_268 * 38000000000.0;
  local_2a8 = local_198 * 0.0 - (local_190 + local_190);
  local_278 = local_100[2];
  dVar3 = exp(-local_1f8 + local_1f0 + local_1e0);
  local_280 = dVar2 * dVar3;
  dVar2 = local_268 / (dVar2 * dVar3);
  local_2b8 = local_190 * (-(local_240 + local_230) + local_248 + 1.0);
  local_2c0 = (local_2a8 - local_2b8) * dVar2;
  local_290 = local_268 * local_260 + -(dVar2 * local_278);
  local_288 = local_2a0 * local_290;
  local_2c8 = local_2a0 * (local_2a8 * local_268 * local_260 + -(local_2c0 * local_278));
  local_158[2] = local_288 + local_158[2];
  local_158[3] = local_158[3] - local_288;
  local_158[5] = local_158[5] - local_288;
  local_268 = local_2a0 * local_268;
  local_270 = local_2a0 * dVar2;
  if (local_10c == 0) {
    local_328[0] = local_290 * 2.5;
    local_328[1] = local_290;
    local_328[2] = local_290 * 12.0 + -(local_2a0 * dVar2);
    local_328[3] = local_268 * local_100[5] + local_290;
    local_328[4] = local_290;
    local_328[5] = local_268 * local_100[3] + local_290;
    local_328[6] = local_290;
    local_328[7] = local_290;
    local_328[8] = local_290;
    for (local_410 = 0; local_410 < 9; local_410 = local_410 + 1) {
      iVar1 = local_410 * 10 + 2;
      local_f8[iVar1] = local_328[local_410] + local_f8[iVar1];
      iVar1 = local_410 * 10 + 3;
      local_f8[iVar1] = local_f8[iVar1] - local_328[local_410];
      iVar1 = local_410 * 10 + 5;
      local_f8[iVar1] = local_f8[iVar1] - local_328[local_410];
    }
  }
  else {
    local_2d0 = local_290 * 1.5;
    local_f8[2] = local_2d0 + local_f8[2];
    local_f8[3] = local_f8[3] - local_2d0;
    local_f8[5] = local_f8[5] - local_2d0;
    local_2d0 = local_290 * 11.0 + -local_270;
    local_f8[0x16] = local_2d0 + local_f8[0x16];
    local_f8[0x17] = local_f8[0x17] - local_2d0;
    local_f8[0x19] = local_f8[0x19] - local_2d0;
    local_2d0 = local_268 * local_100[5];
    local_f8[0x20] = local_2d0 + local_f8[0x20];
    local_f8[0x21] = local_f8[0x21] - local_2d0;
    local_f8[0x23] = local_f8[0x23] - local_2d0;
    local_2d0 = local_268 * local_100[3];
    local_f8[0x34] = local_2d0 + local_f8[0x34];
    local_f8[0x35] = local_f8[0x35] - local_2d0;
    local_f8[0x37] = local_f8[0x37] - local_2d0;
  }
  local_f8[0x5c] = local_2c8 + local_f8[0x5c];
  local_f8[0x5d] = local_f8[0x5d] - local_2c8;
  local_f8[0x5f] = local_f8[0x5f] - local_2c8;
  local_260 = local_100[1] * local_100[3];
  local_268 = exp(local_188 * -0.406 + -(local_190 * 8352.893435692547));
  local_268 = local_268 * 3547000000.0;
  local_2a8 = local_190 * -0.406 + local_198 * 8352.893435692547;
  local_278 = local_100[4] * local_100[5];
  local_280 = exp(((local_200 + local_1f0) - local_1e8) - local_1e0);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (-(local_250 + local_240) + local_238 + local_230);
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[1] = local_158[1] - local_288;
  local_158[3] = local_158[3] - local_288;
  local_158[4] = local_288 + local_158[4];
  local_158[5] = local_288 + local_158[5];
  local_2d0 = local_268 * local_100[3];
  local_f8[0xb] = local_f8[0xb] - local_2d0;
  local_f8[0xd] = local_f8[0xd] - local_2d0;
  local_f8[0xe] = local_2d0 + local_f8[0xe];
  local_f8[0xf] = local_2d0 + local_f8[0xf];
  local_2d0 = local_268 * local_100[1];
  local_f8[0x1f] = local_f8[0x1f] - local_2d0;
  local_f8[0x21] = local_f8[0x21] - local_2d0;
  local_f8[0x22] = local_2d0 + local_f8[0x22];
  local_f8[0x23] = local_2d0 + local_f8[0x23];
  local_2d0 = -local_270 * local_100[5];
  local_f8[0x29] = local_f8[0x29] - local_2d0;
  local_f8[0x2b] = local_f8[0x2b] - local_2d0;
  local_f8[0x2c] = local_2d0 + local_f8[0x2c];
  local_f8[0x2d] = local_2d0 + local_f8[0x2d];
  local_2d0 = -local_270 * local_100[4];
  local_f8[0x33] = local_f8[0x33] - local_2d0;
  local_f8[0x35] = local_f8[0x35] - local_2d0;
  local_f8[0x36] = local_2d0 + local_f8[0x36];
  local_f8[0x37] = local_2d0 + local_f8[0x37];
  local_f8[0x5b] = local_f8[0x5b] - local_2c8;
  local_f8[0x5d] = local_f8[0x5d] - local_2c8;
  local_f8[0x5e] = local_2c8 + local_f8[0x5e];
  local_f8[0x5f] = local_2c8 + local_f8[0x5f];
  local_260 = *local_100 * local_100[4];
  local_268 = exp(local_188 * 2.67 + -(local_190 * 3165.232827911689));
  local_268 = local_268 * 0.0508;
  local_2a8 = local_190 * 2.67 + local_198 * 3165.232827911689;
  local_278 = local_100[3] * local_100[5];
  local_280 = exp(((local_208 - local_1f0) + local_1e8) - local_1e0);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (-(local_258 + local_238) + local_240 + local_230);
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[0] = local_158[0] - local_288;
  local_158[3] = local_288 + local_158[3];
  local_158[4] = local_158[4] - local_288;
  local_158[5] = local_288 + local_158[5];
  local_2d0 = local_268 * local_100[4];
  *local_f8 = *local_f8 - local_2d0;
  local_f8[3] = local_2d0 + local_f8[3];
  local_f8[4] = local_f8[4] - local_2d0;
  local_f8[5] = local_2d0 + local_f8[5];
  local_2d0 = -local_270 * local_100[5];
  local_f8[0x1e] = local_f8[0x1e] - local_2d0;
  local_f8[0x21] = local_2d0 + local_f8[0x21];
  local_f8[0x22] = local_f8[0x22] - local_2d0;
  local_f8[0x23] = local_2d0 + local_f8[0x23];
  local_2d0 = local_268 * *local_100;
  local_f8[0x28] = local_f8[0x28] - local_2d0;
  local_f8[0x2b] = local_2d0 + local_f8[0x2b];
  local_f8[0x2c] = local_f8[0x2c] - local_2d0;
  local_f8[0x2d] = local_2d0 + local_f8[0x2d];
  local_2d0 = -local_270 * local_100[3];
  local_f8[0x32] = local_f8[0x32] - local_2d0;
  local_f8[0x35] = local_2d0 + local_f8[0x35];
  local_f8[0x36] = local_f8[0x36] - local_2d0;
  local_f8[0x37] = local_2d0 + local_f8[0x37];
  local_f8[0x5a] = local_f8[0x5a] - local_2c8;
  local_f8[0x5d] = local_2c8 + local_f8[0x5d];
  local_f8[0x5e] = local_f8[0x5e] - local_2c8;
  local_f8[0x5f] = local_2c8 + local_f8[0x5f];
  local_260 = *local_100 * local_100[5];
  local_268 = exp(local_188 * 1.51 + -(local_190 * 1726.0331637101897));
  local_268 = local_268 * 216.0;
  local_2a8 = local_190 * 1.51 + local_198 * 1726.0331637101897;
  local_278 = local_100[2] * local_100[3];
  local_280 = exp(((local_208 - local_1f8) - local_1f0) + local_1e0);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (-(local_258 + local_230) + local_248 + local_240);
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[0] = local_158[0] - local_288;
  local_158[2] = local_288 + local_158[2];
  local_158[3] = local_288 + local_158[3];
  local_158[5] = local_158[5] - local_288;
  local_2d0 = local_268 * local_100[5];
  *local_f8 = *local_f8 - local_2d0;
  local_f8[2] = local_2d0 + local_f8[2];
  local_f8[3] = local_2d0 + local_f8[3];
  local_f8[5] = local_f8[5] - local_2d0;
  local_2d0 = -local_270 * local_100[3];
  local_f8[0x14] = local_f8[0x14] - local_2d0;
  local_f8[0x16] = local_2d0 + local_f8[0x16];
  local_f8[0x17] = local_2d0 + local_f8[0x17];
  local_f8[0x19] = local_f8[0x19] - local_2d0;
  local_2d0 = -local_270 * local_100[2];
  local_f8[0x1e] = local_f8[0x1e] - local_2d0;
  local_f8[0x20] = local_2d0 + local_f8[0x20];
  local_f8[0x21] = local_2d0 + local_f8[0x21];
  local_f8[0x23] = local_f8[0x23] - local_2d0;
  local_2d0 = local_268 * *local_100;
  local_f8[0x32] = local_f8[0x32] - local_2d0;
  local_f8[0x34] = local_2d0 + local_f8[0x34];
  local_f8[0x35] = local_2d0 + local_f8[0x35];
  local_f8[0x37] = local_f8[0x37] - local_2d0;
  local_f8[0x5a] = local_f8[0x5a] - local_2c8;
  local_f8[0x5c] = local_2c8 + local_f8[0x5c];
  local_f8[0x5d] = local_2c8 + local_f8[0x5d];
  local_f8[0x5f] = local_f8[0x5f] - local_2c8;
  local_260 = local_100[2] * local_100[4];
  local_268 = exp(local_188 * 2.02 + -(local_190 * 6743.103321783248));
  local_268 = local_268 * 2.97;
  local_2a8 = local_190 * 2.02 + local_198 * 6743.103321783248;
  local_278 = local_100[5] * local_100[5];
  local_280 = exp((local_1f8 + local_1e8) - (local_1e0 + local_1e0));
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (local_230 + local_230 + -(local_248 + local_238));
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[2] = local_158[2] - local_288;
  local_158[4] = local_158[4] - local_288;
  local_158[5] = local_288 + local_288 + local_158[5];
  local_2d0 = local_268 * local_100[4];
  local_f8[0x16] = local_f8[0x16] - local_2d0;
  local_f8[0x18] = local_f8[0x18] - local_2d0;
  local_f8[0x19] = local_2d0 + local_2d0 + local_f8[0x19];
  local_2d0 = local_268 * local_100[2];
  local_f8[0x2a] = local_f8[0x2a] - local_2d0;
  local_f8[0x2c] = local_f8[0x2c] - local_2d0;
  local_f8[0x2d] = local_2d0 + local_2d0 + local_f8[0x2d];
  local_2d0 = -local_270 * 2.0 * local_100[5];
  local_f8[0x34] = local_f8[0x34] - local_2d0;
  local_f8[0x36] = local_f8[0x36] - local_2d0;
  local_f8[0x37] = local_2d0 + local_2d0 + local_f8[0x37];
  local_f8[0x5c] = local_f8[0x5c] - local_2c8;
  local_f8[0x5e] = local_f8[0x5e] - local_2c8;
  local_f8[0x5f] = local_2c8 + local_2c8 + local_f8[0x5f];
  local_260 = local_100[3] * local_100[6];
  local_268 = exp(local_188 * 0.0 + -(local_190 * 414.1473159572846));
  local_268 = local_268 * 16600000.0;
  local_2a8 = local_190 * 0.0 + local_198 * 414.1473159572846;
  local_278 = *local_100 * local_100[1];
  local_280 = exp((-local_208 - local_200) + local_1f0 + local_1d8);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (-(local_240 + local_228) + local_258 + local_250);
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[0] = local_288 + local_158[0];
  local_158[1] = local_288 + local_158[1];
  local_158[3] = local_158[3] - local_288;
  local_158[6] = local_158[6] - local_288;
  local_2d0 = -local_270 * local_100[1];
  *local_f8 = local_2d0 + *local_f8;
  local_f8[1] = local_2d0 + local_f8[1];
  local_f8[3] = local_f8[3] - local_2d0;
  local_f8[6] = local_f8[6] - local_2d0;
  local_2d0 = -local_270 * *local_100;
  local_f8[10] = local_2d0 + local_f8[10];
  local_f8[0xb] = local_2d0 + local_f8[0xb];
  local_f8[0xd] = local_f8[0xd] - local_2d0;
  local_f8[0x10] = local_f8[0x10] - local_2d0;
  local_2d0 = local_268 * local_100[6];
  local_f8[0x1e] = local_2d0 + local_f8[0x1e];
  local_f8[0x1f] = local_2d0 + local_f8[0x1f];
  local_f8[0x21] = local_f8[0x21] - local_2d0;
  local_f8[0x24] = local_f8[0x24] - local_2d0;
  local_2d0 = local_268 * local_100[3];
  local_f8[0x3c] = local_2d0 + local_f8[0x3c];
  local_f8[0x3d] = local_2d0 + local_f8[0x3d];
  local_f8[0x3f] = local_f8[0x3f] - local_2d0;
  local_f8[0x42] = local_f8[0x42] - local_2d0;
  local_f8[0x5a] = local_2c8 + local_f8[0x5a];
  local_f8[0x5b] = local_2c8 + local_f8[0x5b];
  local_f8[0x5d] = local_f8[0x5d] - local_2c8;
  local_f8[0x60] = local_f8[0x60] - local_2c8;
  local_260 = local_100[3] * local_100[6];
  local_268 = exp(local_188 * 0.0 + -(local_190 * 148.4489164123924));
  local_268 = local_268 * 70790000.0;
  local_2a8 = local_190 * 0.0 + local_198 * 148.4489164123924;
  local_278 = local_100[5] * local_100[5];
  local_280 = exp((local_1f0 - (local_1e0 + local_1e0)) + local_1d8);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (local_230 + local_230 + -(local_240 + local_228));
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[3] = local_158[3] - local_288;
  local_158[5] = local_288 + local_288 + local_158[5];
  local_158[6] = local_158[6] - local_288;
  local_2d0 = local_268 * local_100[6];
  local_f8[0x21] = local_f8[0x21] - local_2d0;
  local_f8[0x23] = local_2d0 + local_2d0 + local_f8[0x23];
  local_f8[0x24] = local_f8[0x24] - local_2d0;
  local_2d0 = -local_270 * 2.0 * local_100[5];
  local_f8[0x35] = local_f8[0x35] - local_2d0;
  local_f8[0x37] = local_2d0 + local_2d0 + local_f8[0x37];
  local_f8[0x38] = local_f8[0x38] - local_2d0;
  local_2d0 = local_268 * local_100[3];
  local_f8[0x3f] = local_f8[0x3f] - local_2d0;
  local_f8[0x41] = local_2d0 + local_2d0 + local_f8[0x41];
  local_f8[0x42] = local_f8[0x42] - local_2d0;
  local_f8[0x5d] = local_f8[0x5d] - local_2c8;
  local_f8[0x5f] = local_2c8 + local_2c8 + local_f8[0x5f];
  local_f8[0x60] = local_f8[0x60] - local_2c8;
  local_260 = local_100[4] * local_100[6];
  local_268 = exp(local_188 * 0.0 + -(local_190 * 0.0));
  local_268 = local_268 * 32500000.0;
  local_2a8 = local_190 * 0.0 + local_198 * 0.0;
  local_278 = local_100[1] * local_100[5];
  local_280 = exp(((-local_200 + local_1e8) - local_1e0) + local_1d8);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (-(local_238 + local_228) + local_250 + local_230);
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[1] = local_288 + local_158[1];
  local_158[4] = local_158[4] - local_288;
  local_158[5] = local_288 + local_158[5];
  local_158[6] = local_158[6] - local_288;
  local_2d0 = -local_270 * local_100[5];
  local_f8[0xb] = local_2d0 + local_f8[0xb];
  local_f8[0xe] = local_f8[0xe] - local_2d0;
  local_f8[0xf] = local_2d0 + local_f8[0xf];
  local_f8[0x10] = local_f8[0x10] - local_2d0;
  local_2d0 = local_268 * local_100[6];
  local_f8[0x29] = local_2d0 + local_f8[0x29];
  local_f8[0x2c] = local_f8[0x2c] - local_2d0;
  local_f8[0x2d] = local_2d0 + local_f8[0x2d];
  local_f8[0x2e] = local_f8[0x2e] - local_2d0;
  local_2d0 = -local_270 * local_100[1];
  local_f8[0x33] = local_2d0 + local_f8[0x33];
  local_f8[0x36] = local_f8[0x36] - local_2d0;
  local_f8[0x37] = local_2d0 + local_f8[0x37];
  local_f8[0x38] = local_f8[0x38] - local_2d0;
  local_2d0 = local_268 * local_100[4];
  local_f8[0x3d] = local_2d0 + local_f8[0x3d];
  local_f8[0x40] = local_f8[0x40] - local_2d0;
  local_f8[0x41] = local_2d0 + local_f8[0x41];
  local_f8[0x42] = local_f8[0x42] - local_2d0;
  local_f8[0x5b] = local_2c8 + local_f8[0x5b];
  local_f8[0x5e] = local_f8[0x5e] - local_2c8;
  local_f8[0x5f] = local_2c8 + local_f8[0x5f];
  local_f8[0x60] = local_f8[0x60] - local_2c8;
  local_260 = local_100[5] * local_100[6];
  local_268 = exp(local_188 * 0.0 + -(local_190 * -250.09868290494586));
  local_268 = local_268 * 28900000.0;
  local_2a8 = local_190 * 0.0 + local_198 * -250.09868290494586;
  local_278 = local_100[1] * local_100[2];
  local_280 = exp((-local_200 - local_1f8) + local_1e0 + local_1d8);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (-(local_230 + local_228) + local_250 + local_248);
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[1] = local_288 + local_158[1];
  local_158[2] = local_288 + local_158[2];
  local_158[5] = local_158[5] - local_288;
  local_158[6] = local_158[6] - local_288;
  local_2d0 = -local_270 * local_100[2];
  local_f8[0xb] = local_2d0 + local_f8[0xb];
  local_f8[0xc] = local_2d0 + local_f8[0xc];
  local_f8[0xf] = local_f8[0xf] - local_2d0;
  local_f8[0x10] = local_f8[0x10] - local_2d0;
  local_2d0 = -local_270 * local_100[1];
  local_f8[0x15] = local_2d0 + local_f8[0x15];
  local_f8[0x16] = local_2d0 + local_f8[0x16];
  local_f8[0x19] = local_f8[0x19] - local_2d0;
  local_f8[0x1a] = local_f8[0x1a] - local_2d0;
  local_2d0 = local_268 * local_100[6];
  local_f8[0x33] = local_2d0 + local_f8[0x33];
  local_f8[0x34] = local_2d0 + local_f8[0x34];
  local_f8[0x37] = local_f8[0x37] - local_2d0;
  local_f8[0x38] = local_f8[0x38] - local_2d0;
  local_2d0 = local_268 * local_100[5];
  local_f8[0x3d] = local_2d0 + local_f8[0x3d];
  local_f8[0x3e] = local_2d0 + local_f8[0x3e];
  local_f8[0x41] = local_f8[0x41] - local_2d0;
  local_f8[0x42] = local_f8[0x42] - local_2d0;
  local_f8[0x5b] = local_2c8 + local_f8[0x5b];
  local_f8[0x5c] = local_2c8 + local_f8[0x5c];
  local_f8[0x5f] = local_f8[0x5f] - local_2c8;
  local_f8[0x60] = local_f8[0x60] - local_2c8;
  local_260 = local_100[6] * local_100[6];
  local_268 = exp(local_188 * 0.0 + -(local_190 * 6029.542089672155));
  local_268 = local_268 * 420000000.0;
  local_2a8 = local_190 * 0.0 + local_198 * 6029.542089672155;
  local_278 = local_100[1] * local_100[7];
  local_280 = exp((local_1d8 + local_1d8 + -local_200) - local_1d0);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * ((local_250 + local_220) - (local_228 + local_228));
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[1] = local_288 + local_158[1];
  local_158[6] = local_158[6] - (local_288 + local_288);
  local_158[7] = local_288 + local_158[7];
  local_2d0 = -local_270 * local_100[7];
  local_f8[0xb] = local_2d0 + local_f8[0xb];
  local_f8[0x10] = local_f8[0x10] - (local_2d0 + local_2d0);
  local_f8[0x11] = local_2d0 + local_f8[0x11];
  local_2d0 = local_268 * 2.0 * local_100[6];
  local_f8[0x3d] = local_2d0 + local_f8[0x3d];
  local_f8[0x42] = local_f8[0x42] - (local_2d0 + local_2d0);
  local_f8[0x43] = local_2d0 + local_f8[0x43];
  local_2d0 = -local_270 * local_100[1];
  local_f8[0x47] = local_2d0 + local_f8[0x47];
  local_f8[0x4c] = local_f8[0x4c] - (local_2d0 + local_2d0);
  local_f8[0x4d] = local_2d0 + local_f8[0x4d];
  local_f8[0x5b] = local_2c8 + local_f8[0x5b];
  local_f8[0x60] = local_f8[0x60] - (local_2c8 + local_2c8);
  local_f8[0x61] = local_2c8 + local_f8[0x61];
  local_260 = local_100[6] * local_100[6];
  local_268 = exp(local_188 * 0.0 + -(local_190 * -819.8909135956303));
  local_268 = local_268 * 130000.0;
  local_2a8 = local_190 * 0.0 + local_198 * -819.8909135956303;
  local_278 = local_100[1] * local_100[7];
  local_280 = exp((local_1d8 + local_1d8 + -local_200) - local_1d0);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * ((local_250 + local_220) - (local_228 + local_228));
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[1] = local_288 + local_158[1];
  local_158[6] = local_158[6] - (local_288 + local_288);
  local_158[7] = local_288 + local_158[7];
  local_2d0 = -local_270 * local_100[7];
  local_f8[0xb] = local_2d0 + local_f8[0xb];
  local_f8[0x10] = local_f8[0x10] - (local_2d0 + local_2d0);
  local_f8[0x11] = local_2d0 + local_f8[0x11];
  local_2d0 = local_268 * 2.0 * local_100[6];
  local_f8[0x3d] = local_2d0 + local_f8[0x3d];
  local_f8[0x42] = local_f8[0x42] - (local_2d0 + local_2d0);
  local_f8[0x43] = local_2d0 + local_f8[0x43];
  local_2d0 = -local_270 * local_100[1];
  local_f8[0x47] = local_2d0 + local_f8[0x47];
  local_f8[0x4c] = local_f8[0x4c] - (local_2d0 + local_2d0);
  local_f8[0x4d] = local_2d0 + local_f8[0x4d];
  local_f8[0x5b] = local_2c8 + local_f8[0x5b];
  local_f8[0x60] = local_f8[0x60] - (local_2c8 + local_2c8);
  local_f8[0x61] = local_2c8 + local_f8[0x61];
  local_260 = local_100[3] * local_100[7];
  local_268 = exp(local_188 * 0.0 + -(local_190 * 1997.7701632447386));
  local_268 = local_268 * 24100000.0;
  local_2a8 = local_190 * 0.0 + local_198 * 1997.7701632447386;
  local_278 = local_100[2] * local_100[5];
  local_280 = exp(((-local_1f8 + local_1f0) - local_1e0) + local_1d0);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (-(local_240 + local_220) + local_248 + local_230);
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[2] = local_288 + local_158[2];
  local_158[3] = local_158[3] - local_288;
  local_158[5] = local_288 + local_158[5];
  local_158[7] = local_158[7] - local_288;
  local_2d0 = -local_270 * local_100[5];
  local_f8[0x16] = local_2d0 + local_f8[0x16];
  local_f8[0x17] = local_f8[0x17] - local_2d0;
  local_f8[0x19] = local_2d0 + local_f8[0x19];
  local_f8[0x1b] = local_f8[0x1b] - local_2d0;
  local_2d0 = local_268 * local_100[7];
  local_f8[0x20] = local_2d0 + local_f8[0x20];
  local_f8[0x21] = local_f8[0x21] - local_2d0;
  local_f8[0x23] = local_2d0 + local_f8[0x23];
  local_f8[0x25] = local_f8[0x25] - local_2d0;
  local_2d0 = -local_270 * local_100[2];
  local_f8[0x34] = local_2d0 + local_f8[0x34];
  local_f8[0x35] = local_f8[0x35] - local_2d0;
  local_f8[0x37] = local_2d0 + local_f8[0x37];
  local_f8[0x39] = local_f8[0x39] - local_2d0;
  local_2d0 = local_268 * local_100[3];
  local_f8[0x48] = local_2d0 + local_f8[0x48];
  local_f8[0x49] = local_f8[0x49] - local_2d0;
  local_f8[0x4b] = local_2d0 + local_f8[0x4b];
  local_f8[0x4d] = local_f8[0x4d] - local_2d0;
  local_f8[0x5c] = local_2c8 + local_f8[0x5c];
  local_f8[0x5d] = local_f8[0x5d] - local_2c8;
  local_f8[0x5f] = local_2c8 + local_f8[0x5f];
  local_f8[0x61] = local_f8[0x61] - local_2c8;
  local_260 = local_100[3] * local_100[7];
  local_268 = exp(local_188 * 0.0 + -(local_190 * 4000.5724931475243));
  local_268 = local_268 * 48200000.0;
  local_2a8 = local_190 * 0.0 + local_198 * 4000.5724931475243;
  local_278 = *local_100 * local_100[6];
  local_280 = exp(((-local_208 + local_1f0) - local_1d8) + local_1d0);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (-(local_240 + local_220) + local_258 + local_228);
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[0] = local_288 + local_158[0];
  local_158[3] = local_158[3] - local_288;
  local_158[6] = local_288 + local_158[6];
  local_158[7] = local_158[7] - local_288;
  local_2d0 = -local_270 * local_100[6];
  *local_f8 = local_2d0 + *local_f8;
  local_f8[3] = local_f8[3] - local_2d0;
  local_f8[6] = local_2d0 + local_f8[6];
  local_f8[7] = local_f8[7] - local_2d0;
  local_2d0 = local_268 * local_100[7];
  local_f8[0x1e] = local_2d0 + local_f8[0x1e];
  local_f8[0x21] = local_f8[0x21] - local_2d0;
  local_f8[0x24] = local_2d0 + local_f8[0x24];
  local_f8[0x25] = local_f8[0x25] - local_2d0;
  local_2d0 = -local_270 * *local_100;
  local_f8[0x3c] = local_2d0 + local_f8[0x3c];
  local_f8[0x3f] = local_f8[0x3f] - local_2d0;
  local_f8[0x42] = local_2d0 + local_f8[0x42];
  local_f8[0x43] = local_f8[0x43] - local_2d0;
  local_2d0 = local_268 * local_100[3];
  local_f8[0x46] = local_2d0 + local_f8[0x46];
  local_f8[0x49] = local_f8[0x49] - local_2d0;
  local_f8[0x4c] = local_2d0 + local_f8[0x4c];
  local_f8[0x4d] = local_f8[0x4d] - local_2d0;
  local_f8[0x5a] = local_2c8 + local_f8[0x5a];
  local_f8[0x5d] = local_f8[0x5d] - local_2c8;
  local_f8[0x60] = local_2c8 + local_f8[0x60];
  local_f8[0x61] = local_f8[0x61] - local_2c8;
  local_260 = local_100[4] * local_100[7];
  local_268 = exp(local_188 + local_188 + -(local_190 * 1997.7701632447386));
  local_268 = local_268 * 9.55;
  local_2a8 = local_190 + local_190 + local_198 * 1997.7701632447386;
  local_278 = local_100[5] * local_100[6];
  local_280 = exp(((local_1e8 - local_1e0) - local_1d8) + local_1d0);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (-(local_238 + local_220) + local_230 + local_228);
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[4] = local_158[4] - local_288;
  local_158[5] = local_288 + local_158[5];
  local_158[6] = local_288 + local_158[6];
  local_158[7] = local_158[7] - local_288;
  local_2d0 = local_268 * local_100[7];
  local_f8[0x2c] = local_f8[0x2c] - local_2d0;
  local_f8[0x2d] = local_2d0 + local_f8[0x2d];
  local_f8[0x2e] = local_2d0 + local_f8[0x2e];
  local_f8[0x2f] = local_f8[0x2f] - local_2d0;
  local_2d0 = -local_270 * local_100[6];
  local_f8[0x36] = local_f8[0x36] - local_2d0;
  local_f8[0x37] = local_2d0 + local_f8[0x37];
  local_f8[0x38] = local_2d0 + local_f8[0x38];
  local_f8[0x39] = local_f8[0x39] - local_2d0;
  local_2d0 = -local_270 * local_100[5];
  local_f8[0x40] = local_f8[0x40] - local_2d0;
  local_f8[0x41] = local_2d0 + local_f8[0x41];
  local_f8[0x42] = local_2d0 + local_f8[0x42];
  local_f8[0x43] = local_f8[0x43] - local_2d0;
  local_2d0 = local_268 * local_100[4];
  local_f8[0x4a] = local_f8[0x4a] - local_2d0;
  local_f8[0x4b] = local_2d0 + local_f8[0x4b];
  local_f8[0x4c] = local_2d0 + local_f8[0x4c];
  local_f8[0x4d] = local_f8[0x4d] - local_2d0;
  local_f8[0x5e] = local_f8[0x5e] - local_2c8;
  local_f8[0x5f] = local_2c8 + local_f8[0x5f];
  local_f8[0x60] = local_2c8 + local_f8[0x60];
  local_f8[0x61] = local_f8[0x61] - local_2c8;
  local_260 = local_100[5] * local_100[7];
  local_268 = exp(local_188 * 0.0 + -(local_190 * 0.0));
  local_268 = local_268 * 1000000.0;
  local_2a8 = local_190 * 0.0 + local_198 * 0.0;
  local_278 = local_100[2] * local_100[6];
  local_280 = exp(((-local_1f8 + local_1e0) - local_1d8) + local_1d0);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (-(local_230 + local_220) + local_248 + local_228);
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[2] = local_288 + local_158[2];
  local_158[5] = local_158[5] - local_288;
  local_158[6] = local_288 + local_158[6];
  local_158[7] = local_158[7] - local_288;
  local_2d0 = -local_270 * local_100[6];
  local_f8[0x16] = local_2d0 + local_f8[0x16];
  local_f8[0x19] = local_f8[0x19] - local_2d0;
  local_f8[0x1a] = local_2d0 + local_f8[0x1a];
  local_f8[0x1b] = local_f8[0x1b] - local_2d0;
  local_2d0 = local_268 * local_100[7];
  local_f8[0x34] = local_2d0 + local_f8[0x34];
  local_f8[0x37] = local_f8[0x37] - local_2d0;
  local_f8[0x38] = local_2d0 + local_f8[0x38];
  local_f8[0x39] = local_f8[0x39] - local_2d0;
  local_2d0 = -local_270 * local_100[2];
  local_f8[0x3e] = local_2d0 + local_f8[0x3e];
  local_f8[0x41] = local_f8[0x41] - local_2d0;
  local_f8[0x42] = local_2d0 + local_f8[0x42];
  local_f8[0x43] = local_f8[0x43] - local_2d0;
  local_2d0 = local_268 * local_100[5];
  local_f8[0x48] = local_2d0 + local_f8[0x48];
  local_f8[0x4b] = local_f8[0x4b] - local_2d0;
  local_f8[0x4c] = local_2d0 + local_f8[0x4c];
  local_f8[0x4d] = local_f8[0x4d] - local_2d0;
  local_f8[0x5c] = local_2c8 + local_f8[0x5c];
  local_f8[0x5f] = local_f8[0x5f] - local_2c8;
  local_f8[0x60] = local_2c8 + local_f8[0x60];
  local_f8[0x61] = local_f8[0x61] - local_2c8;
  local_260 = local_100[5] * local_100[7];
  local_268 = exp(local_188 * 0.0 + -(local_190 * 4809.241675095709));
  local_268 = local_268 * 580000000.0;
  local_2a8 = local_190 * 0.0 + local_198 * 4809.241675095709;
  local_278 = local_100[2] * local_100[6];
  local_280 = exp(((-local_1f8 + local_1e0) - local_1d8) + local_1d0);
  local_270 = local_268 / local_280;
  local_2b8 = local_190 * (-(local_230 + local_220) + local_248 + local_228);
  local_2c0 = (local_2a8 - local_2b8) * local_270;
  local_288 = local_268 * local_260 + -(local_270 * local_278);
  local_2c8 = local_2a8 * local_268 * local_260 + -(local_2c0 * local_278);
  local_158[2] = local_288 + local_158[2];
  local_158[5] = local_158[5] - local_288;
  local_158[6] = local_288 + local_158[6];
  local_158[7] = local_158[7] - local_288;
  local_2d0 = -local_270 * local_100[6];
  local_f8[0x16] = local_2d0 + local_f8[0x16];
  local_f8[0x19] = local_f8[0x19] - local_2d0;
  local_f8[0x1a] = local_2d0 + local_f8[0x1a];
  local_f8[0x1b] = local_f8[0x1b] - local_2d0;
  local_2d0 = local_268 * local_100[7];
  local_f8[0x34] = local_2d0 + local_f8[0x34];
  local_f8[0x37] = local_f8[0x37] - local_2d0;
  local_f8[0x38] = local_2d0 + local_f8[0x38];
  local_f8[0x39] = local_f8[0x39] - local_2d0;
  local_2d0 = -local_270 * local_100[2];
  local_f8[0x3e] = local_2d0 + local_f8[0x3e];
  local_f8[0x41] = local_f8[0x41] - local_2d0;
  local_f8[0x42] = local_2d0 + local_f8[0x42];
  local_f8[0x43] = local_f8[0x43] - local_2d0;
  local_2d0 = local_268 * local_100[5];
  local_f8[0x48] = local_268 * local_100[5] + local_f8[0x48];
  local_f8[0x4b] = local_f8[0x4b] - local_2d0;
  local_f8[0x4c] = local_2d0 + local_f8[0x4c];
  local_f8[0x4d] = local_f8[0x4d] - local_2d0;
  local_f8[0x5c] = local_2c8 + local_f8[0x5c];
  local_f8[0x5f] = local_f8[0x5f] - local_2c8;
  local_f8[0x60] = local_2c8 + local_f8[0x60];
  local_f8[0x61] = local_f8[0x61] - local_2c8;
  if (local_10c == 0) {
    local_28 = local_458;
    local_30 = &local_188;
    local_38 = local_180;
    if (1000.0 <= local_180) {
      local_458[0] = local_168 * 1.58275179e-15 +
                     local_170 * -9.23157818e-12 +
                     local_178 * -5.63382869e-08 + local_180 * 0.000700064411 + 1.99142337;
      local_458[1] = local_168 * -1.13643531e-15 +
                     local_170 * 1.77528148e-11 +
                     local_178 * -1.25884199e-07 + local_180 * 0.000613519689 + 2.69757819;
      local_458[2] = local_168 * -6.39161787e-15 +
                     local_170 * 1.20099639e-10 +
                     local_178 * -8.73026011e-07 + local_180 * 0.00305629289 + 1.67214561;
      local_458[3] = local_168 * 0.0 + local_170 * 0.0 + local_178 * 0.0 + local_180 * 0.0 + 1.5;
      local_458[4] = local_168 * -4.3680515e-16 +
                     local_170 * 4.55106742e-12 +
                     local_178 * -3.10280335e-09 + local_180 * -2.75506191e-05 + 1.54205966;
      local_458[5] = local_168 * -1.33195876e-15 +
                     local_170 * 3.05218674e-11 +
                     local_178 * -2.59082758e-07 + local_180 * 0.00105650448 + 1.86472886;
      local_458[6] = local_168 * -1.07908535e-14 +
                     local_170 * 1.1424637e-10 +
                     local_178 * -6.3365815e-07 + local_180 * 0.00223982013 + 3.0172109;
      local_458[7] = local_168 * -1.43165356e-14 +
                     local_170 * 2.34890357e-10 +
                     local_178 * -1.47468882e-06 + local_180 * 0.00433613639 + 3.57316685;
      local_458[8] = local_168 * -6.753351e-15 +
                     local_170 * 1.009704e-10 +
                     local_178 * -5.684761e-07 + local_180 * 0.001487977 + 1.92664;
      local_4a8[0] = local_170 * 6.33100716e-15 +
                     local_178 * -2.76947345e-11 + local_180 * -1.12676574e-07 + 0.000700064411;
      local_4a8[1] = local_170 * -4.54574124e-15 +
                     local_178 * 5.32584444e-11 + local_180 * -2.51768398e-07 + 0.000613519689;
      local_4a8[2] = local_170 * -2.55664715e-14 +
                     local_178 * 3.60298917e-10 + local_180 * -1.74605202e-06 + 0.00305629289;
      local_4a8[3] = local_170 * 0.0 + local_178 * 0.0 + local_180 * 0.0 + 0.0;
      local_4a8[4] = local_170 * -1.7472206e-15 +
                     local_178 * 1.36532023e-11 + local_180 * -6.2056067e-09 + -2.75506191e-05;
      local_4a8[5] = local_170 * -5.32783504e-15 +
                     local_178 * 9.15656022e-11 + local_180 * -5.18165516e-07 + 0.00105650448;
      local_4a8[6] = local_170 * -4.3163414e-14 +
                     local_178 * 3.4273911e-10 + local_180 * -1.2673163e-06 + 0.00223982013;
      local_4a8[7] = local_170 * -5.72661424e-14 +
                     local_178 * 7.04671071e-10 + local_180 * -2.94937764e-06 + 0.00433613639;
      local_4a8[8] = local_170 * -2.7013404e-14 +
                     local_178 * 3.029112e-10 + local_180 * -1.1369522e-06 + 0.001487977;
    }
    else {
      local_458[0] = local_168 * 4.13487224e-13 +
                     local_170 * -9.47543433e-11 +
                     local_178 * -8.14301529e-07 + local_180 * 0.000824944174 + 2.29812431;
      local_458[1] = local_168 * -8.76855392e-13 +
                     local_170 * 1.31387723e-09 +
                     local_178 * -5.75615047e-07 + local_180 * 0.00112748635 + 2.2129364;
      local_458[2] = local_168 * -2.50658847e-12 +
                     local_170 * 6.96858127e-09 +
                     local_178 * -6.35469633e-06 + local_180 * 0.00347498246 + 2.38684249;
      local_458[3] = local_168 * 0.0 + local_170 * 0.0 + local_178 * 0.0 + local_180 * 0.0 + 1.5;
      local_458[4] = local_168 * 3.89069636e-13 +
                     local_170 * -1.60284319e-09 +
                     local_178 * 2.4210317e-06 + local_180 * -0.00163816649 + 1.94642878;
      local_458[5] = local_168 * 2.06237379e-12 +
                     local_170 * -5.79853643e-09 +
                     local_178 * 6.52764691e-06 + local_180 * -0.00322544939 + 3.12530561;
      local_458[6] = local_168 * 9.29225124e-12 +
                     local_170 * -2.42763894e-08 +
                     local_178 * 2.11582891e-05 + local_180 * -0.00474912051 + 3.30179801;
      local_458[7] = local_168 * 2.47151475e-12 +
                     local_170 * -4.62580552e-09 +
                     local_178 * -1.48501258e-07 + local_180 * 0.00656922581 + 2.38875365;
      local_458[8] = local_168 * -2.444855e-12 +
                     local_170 * 5.641515e-09 +
                     local_178 * -3.963222e-06 + local_180 * 0.00140824 + 2.298677;
      local_4a8[0] = local_170 * 1.6539489e-12 +
                     local_178 * -2.8426303e-10 + local_180 * -1.62860306e-06 + 0.000824944174;
      local_4a8[1] = local_170 * -3.50742157e-12 +
                     local_178 * 3.94163169e-09 + local_180 * -1.15123009e-06 + 0.00112748635;
      local_4a8[2] = local_170 * -1.00263539e-11 +
                     local_178 * 2.09057438e-08 + local_180 * -1.27093927e-05 + 0.00347498246;
      local_4a8[3] = local_170 * 0.0 + local_178 * 0.0 + local_180 * 0.0 + 0.0;
      local_4a8[4] = local_170 * 1.55627854e-12 +
                     local_178 * -4.80852957e-09 + local_180 * 4.8420634e-06 + -0.00163816649;
      local_4a8[5] = local_170 * 8.24949516e-12 +
                     local_178 * -1.73956093e-08 + local_180 * 1.30552938e-05 + -0.00322544939;
      local_4a8[6] = local_170 * 3.7169005e-11 +
                     local_178 * -7.28291682e-08 + local_180 * 4.23165782e-05 + -0.00474912051;
      local_4a8[7] = local_170 * 9.886059e-12 +
                     local_178 * -1.38774166e-08 + local_180 * -2.97002516e-07 + 0.00656922581;
      local_4a8[8] = local_170 * -9.77942e-12 +
                     local_178 * 1.6924545e-08 + local_180 * -7.926444e-06 + 0.00140824;
    }
    local_8 = &local_4f8;
    local_10 = &local_188;
    local_18 = local_180;
    local_20 = 1.0 / local_180;
    if (1000.0 <= local_180) {
      local_4f8 = local_20 * -835.033997 +
                  local_168 * 3.16550358e-16 +
                  local_170 * -2.30789455e-12 +
                  local_178 * -1.8779429e-08 + local_180 * 0.000350032206 + 1.99142337;
      local_4f0 = local_20 * -1233.93018 +
                  local_168 * -2.27287062e-16 +
                  local_170 * 4.4382037e-12 +
                  local_178 * -4.19613997e-08 + local_180 * 0.000306759845 + 2.69757819;
      local_4e8 = local_20 * -29899.209 +
                  local_168 * -1.27832357e-15 +
                  local_170 * 3.00249098e-11 +
                  local_178 * -2.9100867e-07 + local_180 * 0.00152814644 + 1.67214561;
      local_4e0 = local_20 * 25471.627 +
                  local_168 * 0.0 + local_170 * 0.0 + local_178 * 0.0 + local_180 * 0.0 + 1.5;
      local_4d8 = local_20 * 29230.8027 +
                  local_168 * -8.736103e-17 +
                  local_170 * 1.13776685e-12 +
                  local_178 * -1.03426778e-09 + local_180 * -1.37753096e-05 + 1.54205966;
      local_4d0 = local_20 * 3683.62875 +
                  local_168 * -2.66391752e-16 +
                  local_170 * 7.63046685e-12 +
                  local_178 * -8.63609193e-08 + local_180 * 0.00052825224 + 1.86472886;
      local_4c8 = local_20 * 111.856713 +
                  local_168 * -2.1581707e-15 +
                  local_170 * 2.85615925e-11 +
                  local_178 * -2.11219383e-07 + local_180 * 0.00111991006 + 3.0172109;
      local_4c0 = local_20 * -18006.9609 +
                  local_168 * -2.86330712e-15 +
                  local_170 * 5.87225893e-11 +
                  local_178 * -4.9156294e-07 + local_180 * 0.0021680682 + 3.57316685;
      local_4b8 = local_20 * -922.7977 +
                  local_168 * -1.3506702e-15 +
                  local_170 * 2.52426e-11 +
                  local_178 * -1.89492033e-07 + local_180 * 0.0007439885 + 1.92664;
    }
    else {
      local_4f8 = local_20 * -1012.52087 +
                  local_168 * 8.26974448e-14 +
                  local_170 * -2.36885858e-11 +
                  local_178 * -2.71433843e-07 + local_180 * 0.000412472087 + 2.29812431;
      local_4f0 = local_20 * -1005.24902 +
                  local_168 * -1.75371078e-13 +
                  local_170 * 3.28469308e-10 +
                  local_178 * -1.91871682e-07 + local_180 * 0.000563743175 + 2.2129364;
      local_4e8 = local_20 * -30208.1133 +
                  local_168 * -5.01317694e-13 +
                  local_170 * 1.74214532e-09 +
                  local_178 * -2.11823211e-06 + local_180 * 0.00173749123 + 2.38684249;
      local_4e0 = local_20 * 25471.627 +
                  local_168 * 0.0 + local_170 * 0.0 + local_178 * 0.0 + local_180 * 0.0 + 1.5;
      local_4d8 = local_20 * 29147.6445 +
                  local_168 * 7.78139272e-14 +
                  local_170 * -4.00710797e-10 +
                  local_178 * 8.07010567e-07 + local_180 * -0.000819083245 + 1.94642878;
      local_4d0 = local_20 * 3346.30913 +
                  local_168 * 4.12474758e-13 +
                  local_170 * -1.44963411e-09 +
                  local_178 * 2.1758823e-06 + local_180 * -0.0016127247 + 3.12530561;
      local_4c8 = local_20 * 294.80804 +
                  local_168 * 1.85845025e-12 +
                  local_170 * -6.06909735e-09 +
                  local_178 * 7.05276303e-06 + local_180 * -0.00237456025 + 3.30179801;
      local_4c0 = local_20 * -17663.1465 +
                  local_168 * 4.9430295e-13 +
                  local_170 * -1.15645138e-09 +
                  local_178 * -4.95004193e-08 + local_180 * 0.0032846129 + 2.38875365;
      local_4b8 = local_20 * -1020.9 +
                  local_168 * -4.88971e-13 +
                  local_170 * 1.41037875e-09 +
                  local_178 * -1.321074e-06 + local_180 * 0.00070412 + 2.298677;
    }
    local_500 = &local_4f8;
  }
  else {
    local_70 = local_458;
    local_78 = &local_188;
    local_80 = local_180;
    if (1000.0 <= local_180) {
      local_458[0] = local_168 * 1.58275179e-15 +
                     local_170 * -9.23157818e-12 +
                     local_178 * -5.63382869e-08 + local_180 * 0.000700064411 + 2.99142337;
      local_458[1] = local_168 * -1.13643531e-15 +
                     local_170 * 1.77528148e-11 +
                     local_178 * -1.25884199e-07 + local_180 * 0.000613519689 + 3.69757819;
      local_458[2] = local_168 * -6.39161787e-15 +
                     local_170 * 1.20099639e-10 +
                     local_178 * -8.73026011e-07 + local_180 * 0.00305629289 + 2.67214561;
      local_458[3] = local_168 * 0.0 + local_170 * 0.0 + local_178 * 0.0 + local_180 * 0.0 + 2.5;
      local_458[4] = local_168 * -4.3680515e-16 +
                     local_170 * 4.55106742e-12 +
                     local_178 * -3.10280335e-09 + local_180 * -2.75506191e-05 + 2.54205966;
      local_458[5] = local_168 * -1.33195876e-15 +
                     local_170 * 3.05218674e-11 +
                     local_178 * -2.59082758e-07 + local_180 * 0.00105650448 + 2.86472886;
      local_458[6] = local_168 * -1.07908535e-14 +
                     local_170 * 1.1424637e-10 +
                     local_178 * -6.3365815e-07 + local_180 * 0.00223982013 + 4.0172109;
      local_458[7] = local_168 * -1.43165356e-14 +
                     local_170 * 2.34890357e-10 +
                     local_178 * -1.47468882e-06 + local_180 * 0.00433613639 + 4.57316685;
      local_458[8] = local_168 * -6.753351e-15 +
                     local_170 * 1.009704e-10 +
                     local_178 * -5.684761e-07 + local_180 * 0.001487977 + 2.92664;
      local_4a8[0] = local_170 * 6.33100716e-15 +
                     local_178 * -2.76947345e-11 + local_180 * -1.12676574e-07 + 0.000700064411;
      local_4a8[1] = local_170 * -4.54574124e-15 +
                     local_178 * 5.32584444e-11 + local_180 * -2.51768398e-07 + 0.000613519689;
      local_4a8[2] = local_170 * -2.55664715e-14 +
                     local_178 * 3.60298917e-10 + local_180 * -1.74605202e-06 + 0.00305629289;
      local_4a8[3] = local_170 * 0.0 + local_178 * 0.0 + local_180 * 0.0 + 0.0;
      local_4a8[4] = local_170 * -1.7472206e-15 +
                     local_178 * 1.36532023e-11 + local_180 * -6.2056067e-09 + -2.75506191e-05;
      local_4a8[5] = local_170 * -5.32783504e-15 +
                     local_178 * 9.15656022e-11 + local_180 * -5.18165516e-07 + 0.00105650448;
      local_4a8[6] = local_170 * -4.3163414e-14 +
                     local_178 * 3.4273911e-10 + local_180 * -1.2673163e-06 + 0.00223982013;
      local_4a8[7] = local_170 * -5.72661424e-14 +
                     local_178 * 7.04671071e-10 + local_180 * -2.94937764e-06 + 0.00433613639;
      local_4a8[8] = local_170 * -2.7013404e-14 +
                     local_178 * 3.029112e-10 + local_180 * -1.1369522e-06 + 0.001487977;
    }
    else {
      local_458[0] = local_168 * 4.13487224e-13 +
                     local_170 * -9.47543433e-11 +
                     local_178 * -8.14301529e-07 + local_180 * 0.000824944174 + 3.29812431;
      local_458[1] = local_168 * -8.76855392e-13 +
                     local_170 * 1.31387723e-09 +
                     local_178 * -5.75615047e-07 + local_180 * 0.00112748635 + 3.2129364;
      local_458[2] = local_168 * -2.50658847e-12 +
                     local_170 * 6.96858127e-09 +
                     local_178 * -6.35469633e-06 + local_180 * 0.00347498246 + 3.38684249;
      local_458[3] = local_168 * 0.0 + local_170 * 0.0 + local_178 * 0.0 + local_180 * 0.0 + 2.5;
      local_458[4] = local_168 * 3.89069636e-13 +
                     local_170 * -1.60284319e-09 +
                     local_178 * 2.4210317e-06 + local_180 * -0.00163816649 + 2.94642878;
      local_458[5] = local_168 * 2.06237379e-12 +
                     local_170 * -5.79853643e-09 +
                     local_178 * 6.52764691e-06 + local_180 * -0.00322544939 + 4.12530561;
      local_458[6] = local_168 * 9.29225124e-12 +
                     local_170 * -2.42763894e-08 +
                     local_178 * 2.11582891e-05 + local_180 * -0.00474912051 + 4.30179801;
      local_458[7] = local_168 * 2.47151475e-12 +
                     local_170 * -4.62580552e-09 +
                     local_178 * -1.48501258e-07 + local_180 * 0.00656922581 + 3.38875365;
      local_458[8] = local_168 * -2.444855e-12 +
                     local_170 * 5.641515e-09 +
                     local_178 * -3.963222e-06 + local_180 * 0.00140824 + 3.298677;
      local_4a8[0] = local_170 * 1.6539489e-12 +
                     local_178 * -2.8426303e-10 + local_180 * -1.62860306e-06 + 0.000824944174;
      local_4a8[1] = local_170 * -3.50742157e-12 +
                     local_178 * 3.94163169e-09 + local_180 * -1.15123009e-06 + 0.00112748635;
      local_4a8[2] = local_170 * -1.00263539e-11 +
                     local_178 * 2.09057438e-08 + local_180 * -1.27093927e-05 + 0.00347498246;
      local_4a8[3] = local_170 * 0.0 + local_178 * 0.0 + local_180 * 0.0 + 0.0;
      local_4a8[4] = local_170 * 1.55627854e-12 +
                     local_178 * -4.80852957e-09 + local_180 * 4.8420634e-06 + -0.00163816649;
      local_4a8[5] = local_170 * 8.24949516e-12 +
                     local_178 * -1.73956093e-08 + local_180 * 1.30552938e-05 + -0.00322544939;
      local_4a8[6] = local_170 * 3.7169005e-11 +
                     local_178 * -7.28291682e-08 + local_180 * 4.23165782e-05 + -0.00474912051;
      local_4a8[7] = local_170 * 9.886059e-12 +
                     local_178 * -1.38774166e-08 + local_180 * -2.97002516e-07 + 0.00656922581;
      local_4a8[8] = local_170 * -9.77942e-12 +
                     local_178 * 1.6924545e-08 + local_180 * -7.926444e-06 + 0.00140824;
    }
    local_500 = &local_258;
  }
  local_508 = 0.0;
  local_510 = 0.0;
  local_518 = 0.0;
  local_520 = 0.0;
  for (local_524 = 0; local_524 < 9; local_524 = local_524 + 1) {
    local_508 = local_458[local_524] * local_100[local_524] + local_508;
    local_518 = local_4a8[local_524] * local_100[local_524] + local_518;
    local_510 = local_500[local_524] * local_158[local_524] + local_510;
    local_520 = local_190 * (local_458[local_524] - local_500[local_524]) * local_158[local_524] +
                local_500[local_524] * local_f8[local_524 + 0x5a] + local_520;
  }
  local_530 = 1.0 / local_508;
  dVar2 = local_510 * local_530;
  local_538 = dVar2;
  dVar3 = local_530 * local_108;
  local_540 = dVar3;
  dVar4 = dVar2 * dVar3;
  local_548 = dVar4;
  for (local_554 = 0; local_554 < 9; local_554 = local_554 + 1) {
    local_550 = 0.0;
    for (local_558 = 0; local_558 < 9; local_558 = local_558 + 1) {
      local_550 = local_500[local_558] * local_f8[local_554 * 10 + local_558] + local_550;
    }
    local_f8[local_554 * 10 + 9] = dVar4 * local_458[local_554] + -(dVar3 * local_550);
  }
  local_f8[99] = -dVar3 * local_520 + dVar4 * local_518 + -dVar2;
  if (local_598 == 1) {
    *local_588 = 1;
    local_908 = 1;
    for (local_90c = 0; local_90c < local_594; local_90c = local_90c + 1) {
      iVar1 = local_90c * 10;
      for (local_914 = 0; local_914 < 10; local_914 = local_914 + 1) {
        for (local_918 = 0; local_918 < 10; local_918 = local_918 + 1) {
          if (local_918 == local_914) {
            *(int *)(local_580 + (long)(local_908 + -1) * 4) = local_914 + 1 + iVar1;
            local_908 = local_908 + 1;
          }
          else if ((local_8b8[local_918 * 10 + local_914] != 0.0) ||
                  (NAN(local_8b8[local_918 * 10 + local_914]))) {
            *(int *)(local_580 + (long)(local_908 + -1) * 4) = local_918 + 1 + iVar1;
            local_908 = local_908 + 1;
          }
        }
        local_588[iVar1 + local_914 + 1] = local_908;
      }
    }
  }
  else {
    *local_588 = 0;
    local_91c = 0;
    for (local_920 = 0; local_920 < local_594; local_920 = local_920 + 1) {
      iVar1 = local_920 * 10;
      for (local_928 = 0; local_928 < 10; local_928 = local_928 + 1) {
        for (local_92c = 0; local_92c < 10; local_92c = local_92c + 1) {
          if (local_92c == local_928) {
            *(int *)(local_580 + (long)local_91c * 4) = local_928 + iVar1;
            local_91c = local_91c + 1;
          }
          else if ((local_8b8[local_92c * 10 + local_928] != 0.0) ||
                  (NAN(local_8b8[local_92c * 10 + local_928]))) {
            *(int *)(local_580 + (long)local_91c * 4) = local_92c + iVar1;
            local_91c = local_91c + 1;
          }
        }
        local_588[iVar1 + local_928 + 1] = local_91c;
      }
    }
  }
  return;
}

Assistant:

void
SPARSITY_PREPROC_SYST_CSR(
  int* colVals, int* rowPtr, const int* consP, int NCELLS, int base)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian(&Jac[0], &conc[0], 1500.0, *consP);

  if (base == 1) {
    rowPtr[0] = 1;
    int nJdata_tmp = 1;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 10;
      for (int l = 0; l < 10; l++) {
        for (int k = 0; k < 10; k++) {
          if (k == l) {
            colVals[nJdata_tmp - 1] = l + 1 + offset;
            nJdata_tmp = nJdata_tmp + 1;
          } else {
            if (Jac[10 * k + l] != 0.0) {
              colVals[nJdata_tmp - 1] = k + 1 + offset;
              nJdata_tmp = nJdata_tmp + 1;
            }
          }
        }
        rowPtr[offset + (l + 1)] = nJdata_tmp;
      }
    }
  } else {
    rowPtr[0] = 0;
    int nJdata_tmp = 0;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 10;
      for (int l = 0; l < 10; l++) {
        for (int k = 0; k < 10; k++) {
          if (k == l) {
            colVals[nJdata_tmp] = l + offset;
            nJdata_tmp = nJdata_tmp + 1;
          } else {
            if (Jac[10 * k + l] != 0.0) {
              colVals[nJdata_tmp] = k + offset;
              nJdata_tmp = nJdata_tmp + 1;
            }
          }
        }
        rowPtr[offset + (l + 1)] = nJdata_tmp;
      }
    }
  }
}